

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat::RunImpl
          (TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat *this)

{
  TestDetails *details;
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper fixtureHelper;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture(&fixtureHelper.super_XmlTestReporterFixture);
  fixtureHelper.m_details = details;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper>
            (&fixtureHelper,details);
  XmlTestReporterFixture::~XmlTestReporterFixture(&fixtureHelper.super_XmlTestReporterFixture);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleFailedTestReportSummaryFormat)
{
    TestDetails const details("A Test", "suite", "A File", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "A Failure");
    reporter.ReportSummary(1, 1, 1, 0.1f);

    const char *expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"A Test\" time=\"0\">"
        "<failure message=\"A File(4321) : A Failure\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}